

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O1

void __thiscall WorkerFlow::WorkerFlow(WorkerFlow *this,string *connect,int port,size_t buffsize)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  ostream *poVar4;
  string *psVar5;
  int *piVar6;
  ulong uVar7;
  stringstream notf_addr;
  stringstream stream_addr;
  long *local_360 [2];
  long local_350 [2];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  pvVar2 = (void *)zmq_ctx_new();
  this->m_context = pvVar2;
  pvVar2 = (void *)zmq_socket(pvVar2,7);
  this->m_stream_socket = pvVar2;
  pvVar2 = (void *)zmq_socket(this->m_context,2);
  this->m_notif_socket = pvVar2;
  this->m_cb = (Callback *)0x0;
  this->m_callback_owned = false;
  uVar7 = 0x80000;
  if (buffsize != 0) {
    uVar7 = buffsize;
  }
  pcVar3 = (char *)operator_new__(uVar7);
  this->m_buffer = pcVar3;
  this->m_buffsize = uVar7;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(connect->_M_dataplus)._M_p,connect->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::ostream::operator<<(poVar4,port);
  std::__cxx11::stringstream::stringstream(local_340);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_330,(connect->_M_dataplus)._M_p,connect->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::ostream::operator<<(poVar4,port + 1);
  pvVar2 = this->m_stream_socket;
  std::__cxx11::stringbuf::str();
  iVar1 = zmq_connect(pvVar2,local_360[0]);
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (iVar1 != -1) {
    pvVar2 = this->m_notif_socket;
    std::__cxx11::stringbuf::str();
    iVar1 = zmq_connect(pvVar2,local_360[0]);
    if (local_360[0] != local_350) {
      operator_delete(local_360[0],local_350[0] + 1);
    }
    if (iVar1 != -1) {
      zmq_setsockopt(this->m_notif_socket,6,"",0);
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(aiStack_2c0);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      return;
    }
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    pcVar3 = strerror(*piVar6);
    std::__cxx11::string::string<std::allocator<char>>(psVar5,pcVar3,(allocator<char> *)local_360);
    __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  psVar5 = (string *)__cxa_allocate_exception(0x20);
  piVar6 = __errno_location();
  pcVar3 = strerror(*piVar6);
  std::__cxx11::string::string<std::allocator<char>>(psVar5,pcVar3,(allocator<char> *)local_360);
  __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

WorkerFlow::WorkerFlow(std::string connect, int port, size_t buffsize) : 
    m_context(zmq_ctx_new()),
    m_stream_socket(zmq_socket(m_context, ZMQ_PULL)),
    m_notif_socket(zmq_socket(m_context, ZMQ_SUB)),
    m_cb(NULL),
    m_callback_owned(false),
    m_buffer(new char[(buffsize) ? buffsize : DEFAULT_BUFFER_SIZE]),
    m_buffsize((buffsize) ? buffsize : DEFAULT_BUFFER_SIZE)
{
    // addr
    std::stringstream stream_addr;
    stream_addr << connect << ":" << port;
    std::stringstream notf_addr;
    notf_addr << connect << ":" << (port + 1);
    // connect to the stream endpoint
    int rc = zmq_connect(m_stream_socket, stream_addr.str().c_str());
    if (rc == -1) {
        throw std::string(strerror(errno));
    }
    // connect to to the notification channel endpoint
    rc = zmq_connect(m_notif_socket, notf_addr.str().c_str());
    if (rc == -1) {
        throw std::string(strerror(errno));
    }
    // subscribe to default topic
    zmq_setsockopt(m_notif_socket, ZMQ_SUBSCRIBE, "", 0);
    if (rc == -1) {
        throw std::string(strerror(errno));
    }
}